

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigReference.cpp
# Opt level: O0

int deqp::egl::SurfaceConfig::getColorBufferTypeRank(EGLenum type)

{
  TestError *this;
  char *message;
  Enum<int,_2UL> EVar1;
  GetNameFunc local_98;
  int local_90;
  string local_88;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  EGLenum local_10;
  int local_c;
  EGLenum type_local;
  
  if (type == 0x308e) {
    local_c = 0;
  }
  else if (type == 0x308f) {
    local_c = 1;
  }
  else {
    if (type != 0x3300) {
      local_10 = type;
      this = (TestError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Unknown color buffer type: ",&local_51);
      EVar1 = eglu::getColorBufferTypeStr(local_10);
      local_98 = EVar1.m_getName;
      local_90 = EVar1.m_value;
      tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_88,&local_98);
      std::operator+(&local_30,&local_50,&local_88);
      message = (char *)std::__cxx11::string::c_str();
      tcu::TestError::TestError
                (this,message,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglChooseConfigReference.cpp"
                 ,0x70);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_c = 2;
  }
  return local_c;
}

Assistant:

static int getColorBufferTypeRank (EGLenum type)
	{
		switch (type)
		{
			case EGL_RGB_BUFFER:			return 0;
			case EGL_LUMINANCE_BUFFER:		return 1;
			case EGL_YUV_BUFFER_EXT:		return 2;
			default:
				TCU_THROW(TestError, (std::string("Unknown color buffer type: ") + eglu::getColorBufferTypeStr(type).toString()).c_str());
		}
	}